

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int match_class(int c,int cl)

{
  int iVar1;
  ushort **ppuVar2;
  int in_ESI;
  int in_EDI;
  int res;
  uint local_1c;
  uint local_10;
  
  iVar1 = tolower(in_ESI);
  switch(iVar1) {
  case 0x61:
    ppuVar2 = __ctype_b_loc();
    local_10 = (*ppuVar2)[in_EDI] & 0x400;
    break;
  default:
    return (uint)(in_ESI == in_EDI);
  case 99:
    ppuVar2 = __ctype_b_loc();
    local_10 = (*ppuVar2)[in_EDI] & 2;
    break;
  case 100:
    ppuVar2 = __ctype_b_loc();
    local_10 = (*ppuVar2)[in_EDI] & 0x800;
    break;
  case 0x6c:
    ppuVar2 = __ctype_b_loc();
    local_10 = (*ppuVar2)[in_EDI] & 0x200;
    break;
  case 0x70:
    ppuVar2 = __ctype_b_loc();
    local_10 = (*ppuVar2)[in_EDI] & 4;
    break;
  case 0x73:
    ppuVar2 = __ctype_b_loc();
    local_10 = (*ppuVar2)[in_EDI] & 0x2000;
    break;
  case 0x75:
    ppuVar2 = __ctype_b_loc();
    local_10 = (*ppuVar2)[in_EDI] & 0x100;
    break;
  case 0x77:
    ppuVar2 = __ctype_b_loc();
    local_10 = (*ppuVar2)[in_EDI] & 8;
    break;
  case 0x78:
    ppuVar2 = __ctype_b_loc();
    local_10 = (*ppuVar2)[in_EDI] & 0x1000;
    break;
  case 0x7a:
    local_10 = (uint)(in_EDI == 0);
  }
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[in_ESI] & 0x200) == 0) {
    local_1c = (uint)((local_10 != 0 ^ 0xffU) & 1);
  }
  else {
    local_1c = local_10;
  }
  return local_1c;
}

Assistant:

static int match_class(int c,int cl){
int res;
switch(tolower(cl)){
case'a':res=isalpha(c);break;
case'c':res=iscntrl(c);break;
case'd':res=isdigit(c);break;
case'l':res=islower(c);break;
case'p':res=ispunct(c);break;
case's':res=isspace(c);break;
case'u':res=isupper(c);break;
case'w':res=isalnum(c);break;
case'x':res=isxdigit(c);break;
case'z':res=(c==0);break;
default:return(cl==c);
}
return(islower(cl)?res:!res);
}